

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Room.cpp
# Opt level: O0

void __thiscall Room::Room(Room *this,int roomNumber,int strength,bool audio,bool video)

{
  bool video_local;
  bool audio_local;
  int strength_local;
  int roomNumber_local;
  Room *this_local;
  
  Model<Room>::Model(&this->super_Model<Room>);
  (this->super_Model<Room>)._vptr_Model = (_func_int **)&PTR_save_0016aff0;
  *(int *)&(this->super_Model<Room>).field_0xc = roomNumber;
  this->strength = strength;
  this->audio = audio;
  this->video = video;
  return;
}

Assistant:

Room::Room(int roomNumber, int strength, bool audio, bool video) : roomNumber(roomNumber), strength(strength),
                                                                   audio(audio), video(video) {}